

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::ModeAdd
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this,idx_t row)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  string_t *k;
  mapped_type *pmVar4;
  string_t *psVar5;
  ulong uVar6;
  
  k = GetCell(this,row);
  pmVar4 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::operator[](this->frequency_map,k);
  sVar2 = pmVar4->count;
  uVar1 = sVar2 + 1;
  pmVar4->count = uVar1;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar4->first_row = row;
  }
  else {
    uVar6 = pmVar4->first_row;
    if (row < pmVar4->first_row) {
      uVar6 = row;
    }
    pmVar4->first_row = uVar6;
  }
  if (this->count < uVar1) {
    this->valid = true;
    this->count = uVar1;
    psVar5 = this->mode;
    if (psVar5 == (string_t *)0x0) {
      psVar5 = (string_t *)operator_new(0x10);
      pcVar3 = (k->value).pointer.ptr;
      *(undefined8 *)&psVar5->value = *(undefined8 *)&k->value;
      (psVar5->value).pointer.ptr = pcVar3;
      this->mode = psVar5;
    }
    else {
      pcVar3 = (k->value).pointer.ptr;
      *(undefined8 *)&psVar5->value = *(undefined8 *)&k->value;
      (psVar5->value).pointer.ptr = pcVar3;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}